

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseGenericImage
          (FfsParser *this,UByteArray *buffer,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index)

{
  TreeModel *this_00;
  UINT32 UVar1;
  USTATUS UVar2;
  CBString local_d0;
  CBString info;
  CBString name;
  UByteArray local_88;
  UByteArray local_68;
  UModelIndex local_48;
  
  Bstrlib::CBString::CBString(&name,"UEFI image");
  usprintf(&info,"Full size: %Xh (%u)",(ulong)(uint)(buffer->d)._M_string_length);
  this_00 = this->model;
  Bstrlib::CBString::CBString(&local_d0);
  local_68.d._M_dataplus._M_p = (pointer)&local_68.d.field_2;
  local_68.d._M_string_length = 0;
  local_68.d.field_2._M_local_buf[0] = '\0';
  local_88.d._M_dataplus._M_p = (pointer)&local_88.d.field_2;
  local_88.d._M_string_length = 0;
  local_88.d.field_2._M_local_buf[0] = '\0';
  TreeModel::addItem(&local_48,this_00,localOffset,'>','[',&name,&local_d0,&info,&local_68,buffer,
                     &local_88,Fixed,parent,'\0');
  index->m = local_48.m;
  index->r = local_48.r;
  index->c = local_48.c;
  index->i = local_48.i;
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  Bstrlib::CBString::~CBString(&local_d0);
  UVar1 = TreeModel::base(this->model,parent);
  this->imageBase = UVar1 + localOffset;
  this->protectedRegionsBase = (ulong)(UVar1 + localOffset);
  UVar2 = parseRawArea(this,index);
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  return UVar2;
}

Assistant:

USTATUS FfsParser::parseGenericImage(const UByteArray & buffer, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index)
{
    // Parse as generic UEFI image
    UString name("UEFI image");
    UString info = usprintf("Full size: %Xh (%u)", (UINT32)buffer.size(), (UINT32)buffer.size());
    
    // Add tree item
    index = model->addItem(localOffset, Types::Image, Subtypes::UefiImage, name, UString(), info, UByteArray(), buffer, UByteArray(), Fixed, parent);
    
    // Parse the image as raw area
    imageBase = model->base(parent) + localOffset;
    protectedRegionsBase = imageBase;
    return parseRawArea(index);
}